

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StdSocket.cpp
# Opt level: O0

void __thiscall UdpSocketImpl::Close(UdpSocketImpl *this)

{
  bool bVar1;
  byte bVar2;
  bool bIsLocked;
  UdpSocketImpl *this_local;
  
  this->m_bCloseReq = true;
  do {
    bVar1 = std::mutex::try_lock(&this->m_mxWrite);
    std::condition_variable::notify_all();
    if (bVar1) {
      std::mutex::unlock(&this->m_mxWrite);
    }
    bVar2 = std::__atomic_base::operator_cast_to_unsigned_char
                      ((__atomic_base *)&(this->super_BaseSocketImpl).m_iShutDownState);
    bVar1 = false;
    if ((bVar2 & 2) == 0) {
      bVar1 = (this->super_BaseSocketImpl).m_iError == 0;
    }
  } while (bVar1);
  (this->super_BaseSocketImpl).m_bStop = true;
  return;
}

Assistant:

void UdpSocketImpl::Close()
{
    m_bCloseReq = true; // Stops the write thread after the last byte was send
    do
    {
        const bool bIsLocked = m_mxWrite.try_lock();
        m_cv.notify_all();
        if (bIsLocked == true)
            m_mxWrite.unlock();
    } while ((m_iShutDownState & 2) == 0 && m_iError == 0); // Wait until the write thread is finished
    m_bStop = true; // Stops the listening thread
}